

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O0

char16_t foldCase(char16_t ch)

{
  char16_t cVar1;
  undefined2 unaff_retaddr;
  Case which;
  char16_t in_stack_0000000a;
  
  cVar1 = convertCase_helper<char16_t>(in_stack_0000000a,which);
  return cVar1;
}

Assistant:

static inline char16_t foldCase(char16_t ch) noexcept
{
    return convertCase_helper(ch, QUnicodeTables::CaseFold);
}